

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

int connection_encode_frame
              (ENDPOINT_HANDLE endpoint,AMQP_VALUE performative,PAYLOAD *payloads,
              size_t payload_count,ON_SEND_COMPLETE on_send_complete,void *callback_context)

{
  CONNECTION_HANDLE callback_context_00;
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (endpoint == (ENDPOINT_HANDLE)0x0 || performative == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x80f;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
              ,"connection_encode_frame",0x80e,1,"Bad arguments: endpoint = %p, performative = %p",
              endpoint,performative);
    return 0x80f;
  }
  callback_context_00 = endpoint->connection;
  if (callback_context_00->connection_state == CONNECTION_STATE_OPENED) {
    callback_context_00->on_send_complete = on_send_complete;
    callback_context_00->on_send_complete_callback_context = callback_context;
    iVar1 = amqp_frame_codec_encode_frame
                      (callback_context_00->amqp_frame_codec,endpoint->outgoing_channel,performative
                       ,payloads,payload_count,on_bytes_encoded,callback_context_00);
    if (iVar1 == 0) {
      if ((callback_context_00->field_0xe0 & 8) != 0) {
        log_outgoing_frame(performative);
      }
      iVar1 = tickcounter_get_current_ms
                        (callback_context_00->tick_counter,
                         &callback_context_00->last_frame_sent_time);
      if (iVar1 == 0) {
        return 0;
      }
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x834;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x834;
      }
      pcVar4 = "Getting tick counter value failed";
      iVar3 = 0x833;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x828;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x828;
      }
      pcVar4 = "Encoding AMQP frame failed";
      iVar3 = 0x827;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x81a;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x81a;
    }
    pcVar4 = "Connection not open";
    iVar3 = 0x819;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
            ,"connection_encode_frame",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int connection_encode_frame(ENDPOINT_HANDLE endpoint, AMQP_VALUE performative, PAYLOAD* payloads, size_t payload_count, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    int result;

    /* Codes_S_R_S_CONNECTION_01_249: [If endpoint or performative are NULL, connection_encode_frame shall fail and return a non-zero value.] */
    if ((endpoint == NULL) ||
        (performative == NULL))
    {
        LogError("Bad arguments: endpoint = %p, performative = %p",
            endpoint, performative);
        result = MU_FAILURE;
    }
    else
    {
        CONNECTION_HANDLE connection = (CONNECTION_HANDLE)endpoint->connection;
        AMQP_FRAME_CODEC_HANDLE amqp_frame_codec = connection->amqp_frame_codec;

        /* Codes_S_R_S_CONNECTION_01_254: [If connection_encode_frame is called before the connection is in the OPENED state, connection_encode_frame shall fail and return a non-zero value.] */
        if (connection->connection_state != CONNECTION_STATE_OPENED)
        {
            LogError("Connection not open");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_S_R_S_CONNECTION_01_255: [The payload size shall be computed based on all the payload chunks passed as argument in payloads.] */
            /* Codes_S_R_S_CONNECTION_01_250: [connection_encode_frame shall initiate the frame send by calling amqp_frame_codec_begin_encode_frame.] */
            /* Codes_S_R_S_CONNECTION_01_251: [The channel number passed to amqp_frame_codec_begin_encode_frame shall be the outgoing channel number associated with the endpoint by connection_create_endpoint.] */
            /* Codes_S_R_S_CONNECTION_01_252: [The performative passed to amqp_frame_codec_begin_encode_frame shall be the performative argument of connection_encode_frame.] */
            connection->on_send_complete = on_send_complete;
            connection->on_send_complete_callback_context = callback_context;
            if (amqp_frame_codec_encode_frame(amqp_frame_codec, endpoint->outgoing_channel, performative, payloads, payload_count, on_bytes_encoded, connection) != 0)
            {
                /* Codes_S_R_S_CONNECTION_01_253: [If amqp_frame_codec_begin_encode_frame or amqp_frame_codec_encode_payload_bytes fails, then connection_encode_frame shall fail and return a non-zero value.] */
                LogError("Encoding AMQP frame failed");
                result = MU_FAILURE;
            }
            else
            {
                if (connection->is_trace_on == 1)
                {
                    log_outgoing_frame(performative);
                }

                if (tickcounter_get_current_ms(connection->tick_counter, &connection->last_frame_sent_time) != 0)
                {
                    LogError("Getting tick counter value failed");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_S_R_S_CONNECTION_01_248: [On success it shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}